

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcGetGlobalType(char *name)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ExternVarInfo *pEVar4;
  uint local_28;
  uint i;
  uint hash;
  char *mem;
  char *name_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    pvVar3 = nullcGetVariableData((uint *)0x0);
    if (((NULLC::linker != 0) && (name != (char *)0x0)) && (pvVar3 != (void *)0x0)) {
      uVar1 = NULLC::GetStringHash(name);
      for (local_28 = 0;
          uVar2 = FastVector<ExternVarInfo,_false,_false>::size
                            ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230)),
          local_28 < uVar2; local_28 = local_28 + 1) {
        pEVar4 = FastVector<ExternVarInfo,_false,_false>::operator[]
                           ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),
                            local_28);
        if (pEVar4->nameHash == uVar1) {
          pEVar4 = FastVector<ExternVarInfo,_false,_false>::operator[]
                             ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),
                              local_28);
          return pEVar4->type;
        }
      }
    }
  }
  return 0;
}

Assistant:

unsigned nullcGetGlobalType(const char* name)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !mem)
		return 0;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
			return linker->exVariables[i].type;
	}
	return 0;
}